

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintTo<char,std::char_traits<char>>
               (basic_string_view<char,_std::char_traits<char>_> *value,iu_ostream *os)

{
  char *str_00;
  allocator<char> local_39;
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  iu_ostream *os_local;
  basic_string_view<char,_std::char_traits<char>_> *value_local;
  
  str.field_2._8_8_ = os;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_38,value,&local_39);
  std::allocator<char>::~allocator(&local_39);
  str_00 = (char *)std::__cxx11::string::c_str();
  UniversalTersePrint(str_00,(iu_ostream *)str.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

inline void PrintTo(const ::std::basic_string_view<CharT, Traits>& value, iu_ostream* os)
{
    const ::std::basic_string<CharT, Traits> str{ value };
    UniversalTersePrint(str.c_str(), os);
}